

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void InitClass(nodecontext *p,nodeclass *Class)

{
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  short sVar9;
  int iVar10;
  nodemeta *pnVar11;
  nodemeta *pnVar12;
  nodemetalookuphead *pnVar13;
  long lVar14;
  node *pnVar15;
  ulong uVar16;
  char *pcVar17;
  nodeclass *pnVar18;
  byte bVar19;
  size_t __n;
  char *pcVar20;
  uintptr_t Data;
  array local_48;
  uint8_t local_38 [8];
  
  if (Class->State != '\0') {
    return;
  }
  pnVar11 = Class->Meta;
  if (pnVar11 == (nodemeta *)0x0) {
    return;
  }
  pnVar18 = Class->ParentClass;
  if (Class->ParentId == 0) {
    if (pnVar18 != (nodeclass *)0x0) goto LAB_00118a0b;
  }
  else {
    if (pnVar18 == (nodeclass *)0x0) {
      return;
    }
    if (pnVar18->State < '\x01') {
      return;
    }
LAB_00118a0b:
    if (((Class->VMTSize == 0x48) && (0x48 < pnVar18->VMTSize)) &&
       (Class = NodeClassResize(p,Class,pnVar18->VMTSize), Class == (nodeclass *)0x0)) {
      return;
    }
    uVar16 = pnVar18->VMTSize;
    if (uVar16 < 0x48) {
      __assert_fail("Parent->VMTSize >= DEFAULT_VMT",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x485,"void InitClass(nodecontext *, nodeclass *)");
    }
    if (Class->VMTSize < uVar16) {
      __assert_fail("Class->VMTSize >= Parent->VMTSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x486,"void InitClass(nodecontext *, nodeclass *)");
    }
    if (*(long *)(pnVar18 + 1) != *(long *)(Class + 1)) {
      __assert_fail("NodeClass_Context(Parent) == NodeClass_Context(Class)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x487,"void InitClass(nodecontext *, nodeclass *)");
    }
    uVar2 = *(undefined4 *)&Class[1].Meta;
    memcpy(Class + 1,pnVar18 + 1,uVar16);
    *(undefined4 *)&Class[1].Meta = uVar2;
    pnVar11 = Class->Meta;
  }
  bVar1 = *(byte *)pnVar11;
  if (bVar1 == 0) {
    bVar5 = true;
    if (Class->ParentClass != (nodeclass *)0x0) {
      Class->MetaGet = Class->ParentClass->MetaGet;
    }
LAB_00118c92:
    if (Class->ParentClass == (nodeclass *)0x0) {
LAB_00118cb2:
      if (bVar5) goto LAB_00118cb7;
      local_48._Begin = (char *)0x0;
      local_48._Used = 0;
      if (Class == (nodeclass *)0x0) goto LAB_00118d58;
    }
    else {
      Class->MetaSet = Class->ParentClass->MetaSet;
      if (bVar5) goto LAB_00118cb7;
    }
LAB_00118cda:
    local_48._Used = 0;
    local_48._Begin = (char *)0x0;
    pnVar18 = Class;
    do {
      pnVar11 = pnVar18->Meta;
      if (pnVar11 != (nodemeta *)0x0) {
        bVar1 = *(byte *)pnVar11;
        while (bVar1 != 0) {
          if (((bVar1 == 0x2a) || (bVar1 == 0x2d)) ||
             (((bVar1 & 0xc0) == 0x40 &&
              ((*(char *)(pnVar11 + 1) != '\x02' || ((pnVar11[1].Data & 1) == 0)))))) {
            AddLookup(Class,pnVar11,&local_48);
          }
          pnVar12 = pnVar11 + 1;
          pnVar11 = pnVar11 + 1;
          bVar1 = *(byte *)pnVar12;
        }
      }
      pnVar18 = pnVar18->ParentClass;
    } while (pnVar18 != (nodeclass *)0x0);
    if (local_48._Used == 0) goto LAB_00118d58;
    pnVar13 = BuildLookup(p,&local_48);
  }
  else {
    bVar6 = false;
    bVar5 = false;
    bVar8 = false;
    do {
      pnVar12 = pnVar11 + 1;
      bVar19 = bVar1 & 0xc0;
      bVar4 = true;
      if (bVar19 == 0x40) {
        bVar6 = true;
      }
      if (bVar1 == 0x28) {
        bVar6 = true;
      }
      bVar7 = true;
      if (((bVar1 | 4) != 0x2d) &&
         ((bVar19 != 0x40 || ((*(byte *)pnVar12 == 2 && ((pnVar11[1].Data & 1) != 0)))))) {
        bVar7 = bVar8;
      }
      if (((bVar1 != 0x2a) && (bVar1 != 0x2d)) &&
         ((bVar19 != 0x40 || ((*(byte *)pnVar12 == 2 && ((pnVar11[1].Data & 1) != 0)))))) {
        bVar4 = bVar5;
      }
      bVar1 = *(byte *)pnVar12;
      pnVar11 = pnVar12;
      bVar5 = bVar4;
      bVar8 = bVar7;
    } while (bVar1 != 0);
    bVar5 = !bVar4;
    if (bVar6) {
      local_48._Begin = (char *)0x0;
      local_48._Used = 0;
      if (Class == (nodeclass *)0x0) {
        if (!bVar7) goto LAB_00118c92;
LAB_00118c87:
        local_48._Used = 0;
        local_48._Begin = (char *)0x0;
        if (bVar4) goto LAB_00118d58;
        goto LAB_00118cb7;
      }
      pnVar18 = Class;
      do {
        pnVar11 = pnVar18->Meta;
        if (pnVar11 != (nodemeta *)0x0) {
          bVar1 = *(byte *)pnVar11;
          while (bVar1 != 0) {
            if ((bVar1 == 0x28) || ((bVar1 & 0xc0) == 0x40)) {
              AddLookup(Class,pnVar11,&local_48);
            }
            pnVar12 = pnVar11 + 1;
            pnVar11 = pnVar11 + 1;
            bVar1 = *(byte *)pnVar12;
          }
        }
        pnVar18 = pnVar18->ParentClass;
      } while (pnVar18 != (nodeclass *)0x0);
      if (local_48._Used == 0) goto LAB_00118bdb;
      pnVar13 = BuildLookup(p,&local_48);
LAB_00118bc4:
      Class->MetaGet = pnVar13;
      if (!bVar7) goto LAB_00118c92;
    }
    else {
      if (Class->ParentClass != (nodeclass *)0x0) {
        pnVar13 = Class->ParentClass->MetaGet;
        goto LAB_00118bc4;
      }
LAB_00118bdb:
      if (!bVar7) goto LAB_00118c92;
      if (Class == (nodeclass *)0x0) goto LAB_00118c87;
    }
    local_48._Used = 0;
    local_48._Begin = (char *)0x0;
    pnVar18 = Class;
    do {
      pnVar11 = pnVar18->Meta;
      if (pnVar11 != (nodemeta *)0x0) {
        bVar1 = *(byte *)pnVar11;
        while (bVar1 != 0) {
          if (((bVar1 | 4) == 0x2d) ||
             (((bVar1 & 0xc0) == 0x40 &&
              ((*(char *)(pnVar11 + 1) != '\x02' || ((pnVar11[1].Data & 1) == 0)))))) {
            AddLookup(Class,pnVar11,&local_48);
          }
          pnVar12 = pnVar11 + 1;
          pnVar11 = pnVar11 + 1;
          bVar1 = *(byte *)pnVar12;
        }
      }
      pnVar18 = pnVar18->ParentClass;
    } while (pnVar18 != (nodeclass *)0x0);
    if (local_48._Used == 0) goto LAB_00118cb2;
    pnVar13 = BuildLookup(p,&local_48);
    Class->MetaSet = pnVar13;
    if (bVar4) goto LAB_00118cda;
LAB_00118cb7:
    if (Class->ParentClass == (nodeclass *)0x0) goto LAB_00118d58;
    pnVar13 = Class->ParentClass->MetaUnSet;
  }
  Class->MetaUnSet = pnVar13;
LAB_00118d58:
  if (Class->VMTSize < 0x48) {
    __assert_fail("Class->VMTSize >= DEFAULT_VMT",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x490,"void InitClass(nodecontext *, nodeclass *)");
  }
  Class->State = '\x01';
  uVar3 = *(uint *)Class->Meta;
  if ((char)uVar3 != '\0') {
    pnVar18 = Class + 1;
    pnVar11 = Class->Meta;
    do {
      if ((~uVar3 & 0xc0) == 0) {
        if ((0x20421e08642U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          __n = (size_t)ParamSize[uVar3 & 0x3f];
          memset((void *)((long)&pnVar18->FourCC + (ulong)(uVar3 >> 8)),0,__n);
          if (7 < __n) {
            __n = 8;
          }
          memcpy((void *)((long)&pnVar18->FourCC + (ulong)(*(uint *)pnVar11 >> 8)),&pnVar11->Data,
                 __n);
        }
        else {
          *(uintptr_t *)((long)&pnVar18->FourCC + (ulong)(uVar3 >> 8)) = pnVar11->Data;
        }
      }
      else {
        switch(uVar3 & 0xff) {
        case 0xb:
          Class->Flags = (uint8_t)pnVar11->Data;
          break;
        case 0xc:
          sVar9 = (short)(int)pnVar11->Data;
LAB_00118e8c:
          Class->Priority = sVar9 + -1000;
          break;
        case 0x10:
          iVar10 = (*(code *)pnVar11->Data)(*(undefined4 *)&Class[1].Meta);
          if (iVar10 != 0) {
            ReleaseMetaLookup(p,Class);
            p->NodeCache = (void *)0x0;
            Class->State = -2;
          }
          break;
        case 0x12:
          lVar14 = (*(code *)pnVar11->Data)(p,pnVar18,0xb,local_38);
          if (lVar14 != 0) {
            Class->Flags = local_38[0];
          }
          lVar14 = (*(code *)pnVar11->Data)(p,pnVar18,0xc,local_38);
          if (lVar14 != 0) {
            sVar9 = (short)local_38._0_4_;
            goto LAB_00118e8c;
          }
        }
      }
      uVar3 = *(uint *)(pnVar11 + 1);
      pnVar11 = pnVar11 + 1;
    } while ((char)uVar3 != '\0');
    if (Class->State < '\x01') {
      return;
    }
  }
  if (((Class->Flags & 0x21) == 1) &&
     (pnVar15 = NodeCreateFromClass(p,Class,1), pnVar15 == (node *)0x0)) {
    p->NodeCache = (void *)0x0;
    Class->State = -2;
    UnInitClass(p,Class,0);
  }
  if (('\0' < Class->State) && (uVar16 = (p->NodeClass)._Used, 7 < uVar16)) {
    pcVar17 = (p->NodeClass)._Begin;
    pcVar20 = pcVar17;
    do {
      if ((*(nodeclass **)pcVar20)->ParentClass == Class) {
        InitClass(p,*(nodeclass **)pcVar20);
        pcVar17 = (p->NodeClass)._Begin;
        uVar16 = (p->NodeClass)._Used;
      }
      pcVar20 = pcVar20 + 8;
    } while (pcVar20 != pcVar17 + (uVar16 & 0xfffffffffffffff8));
  }
  return;
}

Assistant:

static void InitClass(nodecontext* p,nodeclass* Class)
{
    const nodeclass* Parent = Class->ParentClass;
    if (Class->State==CLASS_REGISTERED && Class->Meta && (!Class->ParentId || (Parent && Parent->State>=CLASS_INITED)))
    {
        uintptr_t Data;
        const nodemeta* i;

        if (Parent)
        {
            fourcc_t ClassId;

            if (Class->VMTSize == DEFAULT_VMT && Parent->VMTSize > DEFAULT_VMT)
            {
                Class = NodeClassResize(p,Class,Parent->VMTSize);
                if (!Class)
                    return;
            }

            assert(Parent->VMTSize >= DEFAULT_VMT);
            assert(Class->VMTSize >= Parent->VMTSize);
            assert(NodeClass_Context(Parent) == NodeClass_Context(Class));

            ClassId = NodeClass_ClassId(Class);
            memcpy(Class+1,Parent+1,MIN(Class->VMTSize,Parent->VMTSize));
            NodeClass_ClassId(Class) = ClassId;
        }

        BuildMetaLookup(p,Class);

        assert(Class->VMTSize >= DEFAULT_VMT);
        Class->State = CLASS_INITED;

        for (i=Class->Meta;i->Meta != META_CLASS_PARENT_ID;++i)
        {
            if ((i->Meta & META_MODE_MASK)==META_MODE_VMT)
            {
#if defined(CONFIG_CORECDOC)
                if ((i->Meta & ~META_MODE_MASK)==TYPE_FUNC) // otherwise it might be some doc items
#endif
                    MetaConst(i,Class+1);
            }
            else
            switch (i->Meta)
            {
            case META_CLASS_VMT_CREATE:
                if (((int(*)(fourcc_t,void*))i->Data)(NodeClass_ClassId(Class),Class+1) != ERR_NONE)
                {
                    ReleaseMetaLookup(p,Class);
                    p->NodeCache = NULL;
                    Class->State = CLASS_FAILED;
                }
                break;

            case META_CLASS_META:
                if (((bool_t(*)(nodecontext*,void*,datameta,uintptr_t*))i->Data)(p,Class+1,META_CLASS_FLAGS,&Data))
                    Class->Flags = (uint8_t)Data;
                if (((bool_t(*)(nodecontext*,void*,datameta,uintptr_t*))i->Data)(p,Class+1,META_CLASS_PRIORITY,&Data))
                    Class->Priority = (int16_t)(Data-PRI_DEFAULT);
                break;

            case META_CLASS_FLAGS:
                Class->Flags = (uint8_t)i->Data;
                break;

            case META_CLASS_PRIORITY:
                Class->Priority = (int16_t)(i->Data-PRI_DEFAULT);
                break;
            }
        }

        if (Class->State>=CLASS_INITED && (Class->Flags & (CFLAG_SINGLETON|CFLAG_OWN_MEMORY))==CFLAG_SINGLETON && !NodeCreateFromClass(p,Class,1))
        {
            p->NodeCache = NULL;
            Class->State = CLASS_FAILED;
            UnInitClass(p,Class,0); // just to call META_CLASS_VMT_DELETE
        }

        if (Class->State>=CLASS_INITED)
        {
            nodeclass** nc;
            for (nc=ARRAYBEGIN(p->NodeClass,nodeclass*);nc!=ARRAYEND(p->NodeClass,nodeclass*);++nc)
                if ((*nc)->ParentClass == Class)
                    InitClass(p,*nc);
        }
    }
}